

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O2

qint64 __thiscall QHttpPartPrivate::size(QHttpPartPrivate *this)

{
  long lVar1;
  long lVar2;
  
  checkHeaderCreated(this);
  lVar1 = (this->header).d.size;
  if (this->bodyDevice == (QIODevice *)0x0) {
    lVar2 = (this->body).d.size;
  }
  else {
    lVar2 = (**(code **)(*(long *)this->bodyDevice + 0x80))();
  }
  return lVar2 + lVar1;
}

Assistant:

qint64 QHttpPartPrivate::size() const
{
    checkHeaderCreated();
    qint64 size = header.size();
    if (bodyDevice) {
        size += bodyDevice->size();
    } else {
        size += body.size();
    }
    return size;
}